

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall
mpt::reference<mpt::layout::graph::data>::reference
          (reference<mpt::layout::graph::data> *this,reference<mpt::layout::graph::data> *ref)

{
  this->_ref = (data *)0x0;
  operator=(this,ref);
  return;
}

Assistant:

inline reference(const reference &ref) : _ref(0)
	{
		*this = ref;
	}